

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_fuse.hpp
# Opt level: O1

optional<unsigned_long>
magic_enum::detail::fuse_enum<Color,Directions,Index>(Color head,Directions tail,Index tail_1)

{
  _Storage<unsigned_long,_true> _Var1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  optional<unsigned_long> oVar5;
  
  oVar5 = fuse_enum<Directions,Index>(tail,tail_1);
  _Var1._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    uVar3 = 0;
  }
  else {
    if (head == RED) {
      uVar3 = CONCAT71(oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._9_7_,1);
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        if (uVar4 == 2) {
          uVar2 = 3;
          uVar4 = 2;
          break;
        }
        uVar2 = uVar4 + 1;
      } while ((&DAT_001944a8)[uVar4] != head);
      uVar3 = CONCAT71((int7)(uVar4 >> 8),uVar4 < 2);
    }
    _Var1._M_value = _Var1._M_value << 2 | uVar2;
  }
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

constexpr optional<std::uintmax_t> fuse_enum(E head, Es... tail) noexcept {
  return fuse_one_enum(fuse_enum(tail...), head);
}